

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testExistingStreams.cpp
# Opt level: O0

void anon_unknown.dwarf_eb2ac::fillPixels1(Array2D<Imf_2_5::Rgba> *pixels,int w,int h)

{
  Rgba *pRVar1;
  int in_EDX;
  int in_ESI;
  Array2D<Imf_2_5::Rgba> *in_RDI;
  float fVar2;
  Rgba *p;
  int x;
  int y;
  float in_stack_ffffffffffffffdc;
  int local_18;
  int local_14;
  
  for (local_14 = 0; local_14 < in_EDX; local_14 = local_14 + 1) {
    for (local_18 = 0; local_18 < in_ESI; local_18 = local_18 + 1) {
      pRVar1 = Imf_2_5::Array2D<Imf_2_5::Rgba>::operator[](in_RDI,(long)local_14);
      pRVar1 = pRVar1 + local_18;
      half::operator=(&pRVar1->r,in_stack_ffffffffffffffdc);
      half::operator=(&pRVar1->r,in_stack_ffffffffffffffdc);
      half::operator=(&pRVar1->r,in_stack_ffffffffffffffdc);
      in_stack_ffffffffffffffdc = half::operator_cast_to_float(&pRVar1->r);
      fVar2 = half::operator_cast_to_float(&pRVar1->b);
      in_stack_ffffffffffffffdc = in_stack_ffffffffffffffdc + fVar2;
      half::operator_cast_to_float(&pRVar1->g);
      half::operator=(&pRVar1->r,in_stack_ffffffffffffffdc);
    }
  }
  return;
}

Assistant:

void
fillPixels1 (Array2D<Rgba> &pixels, int w, int h)
{
    for (int y = 0; y < h; ++y)
    {
	for (int x = 0; x < w; ++x)
	{
	    Rgba &p = pixels[y][x];

	    p.r = (x & 1);
	    p.g = ((x + y) & 1);
	    p.b = (y & 1);
	    p.a = (p.r + p.b + p.g) / 3.0;
	}
    }
}